

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapt_slots.cpp
# Opt level: O0

int main(void)

{
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  __sighandler_t __handler_02;
  int in_ESI;
  int __sig;
  anon_class_8_1_54a39809 *paVar1;
  anon_class_8_1_54a39809_for_g *f;
  undefined1 *value;
  connection cVar2;
  int local_26c [3];
  connection local_260;
  anon_class_8_1_54a39809_for_g local_250;
  undefined1 local_248 [8];
  signal<int_(int)> d;
  anon_class_8_1_54a39809 local_1c0;
  undefined1 local_1b8 [8];
  signal<int_()> c;
  anon_class_8_1_54a39809_for_g local_130;
  undefined1 local_128 [8];
  signal<void_(int)> b;
  anon_class_8_1_54a39809 local_90;
  undefined1 local_88 [8];
  signal<void_()> a;
  int i;
  
  a.m_slots._108_4_ = 0;
  obs::signal<void_()>::signal((signal<void_()> *)local_88,in_ESI,in_RDX);
  local_90.i = (int *)&a.m_slots.field_0x6c;
  paVar1 = &local_90;
  cVar2 = obs::signal<void()>::connect<main::__0>((signal<void()> *)local_88,paVar1);
  b.m_slots._104_8_ = cVar2.m_signal;
  obs::signal<void_(int)>::signal
            ((signal<void_(int)> *)local_128,(int)paVar1,(__sighandler_t)cVar2.m_slot);
  local_130.i = (int *)&a.m_slots.field_0x6c;
  f = &local_130;
  cVar2 = obs::signal<void(int)>::connect<main::__1>((signal<void(int)> *)local_128,f);
  c.m_slots._104_8_ = cVar2.m_signal;
  obs::signal<int_()>::signal((signal<int_()> *)local_1b8,(int)f,(__sighandler_t)cVar2.m_slot);
  local_1c0.i = (int *)&a.m_slots.field_0x6c;
  paVar1 = &local_1c0;
  cVar2 = obs::signal<int()>::connect<main::__2>((signal<int()> *)local_1b8,paVar1);
  d.m_slots._104_8_ = cVar2.m_signal;
  obs::signal<int_(int)>::signal
            ((signal<int_(int)> *)local_248,(int)paVar1,(__sighandler_t)cVar2.m_slot);
  local_250.i = (int *)&a.m_slots.field_0x6c;
  local_260 = obs::signal<int(int)>::connect<main::__3>((signal<int(int)> *)local_248,&local_250);
  obs::signal<void_()>::operator()<>((signal<void_()> *)local_88);
  local_26c[2] = 1;
  obs::signal<void(int)>::operator()((signal<void(int)> *)local_128,local_26c + 2);
  obs::signal<int_()>::operator()<>((signal<int_()> *)local_1b8);
  local_26c[1] = 1;
  obs::signal<int(int)>::operator()((signal<int(int)> *)local_248,local_26c + 1);
  local_26c[0] = 4;
  value = &a.m_slots.field_0x6c;
  expect_eq<int,int>(local_26c,(int *)value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/adapt_slots.cpp"
                     ,0x1a);
  __sig = (int)value;
  obs::signal<int_(int)>::~signal((signal<int_(int)> *)local_248,__sig,__handler);
  obs::signal<int_()>::~signal((signal<int_()> *)local_1b8,__sig,__handler_00);
  obs::signal<void_(int)>::~signal((signal<void_(int)> *)local_128,__sig,__handler_01);
  obs::signal<void_()>::~signal((signal<void_()> *)local_88,__sig,__handler_02);
  return 0;
}

Assistant:

int main() {
  static_assert(true == obs::is_callable_without_args<void()>::value, "");
  static_assert(true == obs::is_callable_without_args<int()>::value, "");
  static_assert(false == obs::is_callable_without_args<void(int)>::value, "");
  static_assert(false == obs::is_callable_without_args<int(int)>::value, "");

  int i = 0;
  obs::signal<void()   > a; a.connect([&i]{ ++i; });
  obs::signal<void(int)> b; b.connect([&i]{ ++i; });
  obs::signal<int ()   > c; c.connect([&i]{ return ++i; });
  obs::signal<int (int)> d; d.connect([&i]{ return ++i; });

  a();
  b(1);
  c();
  d(1);
  EXPECT_EQ(4, i);
}